

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::Builtins::registerStringMethods(Builtins *this)

{
  Builtins *in_RDI;
  unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
  *in_stack_fffffffffffffd38;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffffd40;
  shared_ptr<slang::ast::SystemSubroutine> *this_00;
  Builtins *in_stack_fffffffffffffd58;
  Builtins *__args;
  KnownSystemName *in_stack_fffffffffffffd60;
  KnownSystemName *__args_1;
  Builtins *in_stack_fffffffffffffd68;
  Builtins *__args_00;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffffdb8;
  shared_ptr<slang::ast::SystemSubroutine> *method;
  undefined8 in_stack_fffffffffffffdc0;
  SymbolKind SVar1;
  shared_ptr<slang::ast::SystemSubroutine> local_228;
  undefined1 local_20d;
  undefined4 local_20c;
  undefined1 local_1ed;
  undefined4 local_1ec;
  undefined1 local_1cd;
  undefined4 local_1cc;
  undefined1 local_1c8 [80];
  Kind local_178;
  undefined4 local_174;
  SourceLocation local_158 [4];
  undefined4 local_138;
  undefined4 local_134;
  SymbolKind local_118;
  undefined4 local_114;
  undefined1 local_dd;
  undefined4 local_dc;
  undefined1 local_bd;
  undefined4 local_bc;
  undefined1 local_9d;
  undefined4 local_9c;
  undefined1 local_7d;
  undefined4 local_7c;
  shared_ptr<slang::ast::SystemSubroutine> local_60;
  undefined1 local_48 [72];
  
  SVar1 = (SymbolKind)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
  std::make_unique<slang::ast::builtins::StringLenMethod,slang::ast::builtins::Builtins&>
            (in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringLenMethod,std::default_delete<slang::ast::builtins::StringLenMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringLenMethod,_std::default_delete<slang::ast::builtins::StringLenMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,in_stack_fffffffffffffdb8);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb36ac4);
  std::
  unique_ptr<slang::ast::builtins::StringLenMethod,_std::default_delete<slang::ast::builtins::StringLenMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringLenMethod,_std::default_delete<slang::ast::builtins::StringLenMethod>_>
                 *)in_stack_fffffffffffffd40);
  SVar1 = (SymbolKind)((ulong)local_48 >> 0x20);
  std::make_unique<slang::ast::builtins::StringPutcMethod,slang::ast::builtins::Builtins&>
            (in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringPutcMethod,std::default_delete<slang::ast::builtins::StringPutcMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringPutcMethod,_std::default_delete<slang::ast::builtins::StringPutcMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,in_stack_fffffffffffffdb8);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb36b2e);
  std::
  unique_ptr<slang::ast::builtins::StringPutcMethod,_std::default_delete<slang::ast::builtins::StringPutcMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringPutcMethod,_std::default_delete<slang::ast::builtins::StringPutcMethod>_>
                 *)in_stack_fffffffffffffd40);
  method = &local_60;
  std::make_unique<slang::ast::builtins::StringGetcMethod,slang::ast::builtins::Builtins&>
            (in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringGetcMethod,std::default_delete<slang::ast::builtins::StringGetcMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringGetcMethod,_std::default_delete<slang::ast::builtins::StringGetcMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb36b98);
  std::
  unique_ptr<slang::ast::builtins::StringGetcMethod,_std::default_delete<slang::ast::builtins::StringGetcMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringGetcMethod,_std::default_delete<slang::ast::builtins::StringGetcMethod>_>
                 *)in_stack_fffffffffffffd40);
  local_7c = 0x10e;
  local_7d = 1;
  std::
  make_unique<slang::ast::builtins::StringUpperLowerMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,bool>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,(bool *)in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringUpperLowerMethod,std::default_delete<slang::ast::builtins::StringUpperLowerMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringUpperLowerMethod,_std::default_delete<slang::ast::builtins::StringUpperLowerMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb36c1f);
  std::
  unique_ptr<slang::ast::builtins::StringUpperLowerMethod,_std::default_delete<slang::ast::builtins::StringUpperLowerMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringUpperLowerMethod,_std::default_delete<slang::ast::builtins::StringUpperLowerMethod>_>
                 *)in_stack_fffffffffffffd40);
  local_9c = 0x10f;
  local_9d = 0;
  std::
  make_unique<slang::ast::builtins::StringUpperLowerMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,bool>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,(bool *)in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringUpperLowerMethod,std::default_delete<slang::ast::builtins::StringUpperLowerMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringUpperLowerMethod,_std::default_delete<slang::ast::builtins::StringUpperLowerMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb36ca6);
  std::
  unique_ptr<slang::ast::builtins::StringUpperLowerMethod,_std::default_delete<slang::ast::builtins::StringUpperLowerMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringUpperLowerMethod,_std::default_delete<slang::ast::builtins::StringUpperLowerMethod>_>
                 *)in_stack_fffffffffffffd40);
  local_bc = 0x110;
  local_bd = Unknown >> 0x18;
  std::
  make_unique<slang::ast::builtins::StringCompareMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,bool>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,(bool *)in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringCompareMethod,std::default_delete<slang::ast::builtins::StringCompareMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringCompareMethod,_std::default_delete<slang::ast::builtins::StringCompareMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb36d2d);
  std::
  unique_ptr<slang::ast::builtins::StringCompareMethod,_std::default_delete<slang::ast::builtins::StringCompareMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringCompareMethod,_std::default_delete<slang::ast::builtins::StringCompareMethod>_>
                 *)in_stack_fffffffffffffd40);
  local_dc = 0x111;
  local_dd = 1;
  std::
  make_unique<slang::ast::builtins::StringCompareMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,bool>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,(bool *)in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringCompareMethod,std::default_delete<slang::ast::builtins::StringCompareMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringCompareMethod,_std::default_delete<slang::ast::builtins::StringCompareMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb36db4);
  std::
  unique_ptr<slang::ast::builtins::StringCompareMethod,_std::default_delete<slang::ast::builtins::StringCompareMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringCompareMethod,_std::default_delete<slang::ast::builtins::StringCompareMethod>_>
                 *)in_stack_fffffffffffffd40);
  std::make_unique<slang::ast::builtins::StringSubstrMethod,slang::ast::builtins::Builtins&>
            (in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringSubstrMethod,std::default_delete<slang::ast::builtins::StringSubstrMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringSubstrMethod,_std::default_delete<slang::ast::builtins::StringSubstrMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb36e18);
  std::
  unique_ptr<slang::ast::builtins::StringSubstrMethod,_std::default_delete<slang::ast::builtins::StringSubstrMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringSubstrMethod,_std::default_delete<slang::ast::builtins::StringSubstrMethod>_>
                 *)in_stack_fffffffffffffd40);
  local_114 = 0x112;
  local_118 = EnumType;
  std::
  make_unique<slang::ast::builtins::StringAtoIMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,int>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,(int *)in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringAtoIMethod,std::default_delete<slang::ast::builtins::StringAtoIMethod>,void>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb36ea2);
  std::
  unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
                 *)in_stack_fffffffffffffd40);
  local_134 = 0x113;
  local_138 = 0x10;
  std::
  make_unique<slang::ast::builtins::StringAtoIMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,int>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,(int *)in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringAtoIMethod,std::default_delete<slang::ast::builtins::StringAtoIMethod>,void>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb36f2c);
  std::
  unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
                 *)in_stack_fffffffffffffd40);
  local_158[0]._4_4_ = 0x114;
  local_158[0]._0_4_ = 8;
  std::
  make_unique<slang::ast::builtins::StringAtoIMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,int>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,(int *)in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringAtoIMethod,std::default_delete<slang::ast::builtins::StringAtoIMethod>,void>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb36fb6);
  std::
  unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
                 *)in_stack_fffffffffffffd40);
  local_174 = 0x115;
  local_178 = Reg;
  std::
  make_unique<slang::ast::builtins::StringAtoIMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,int>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,(int *)in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringAtoIMethod,std::default_delete<slang::ast::builtins::StringAtoIMethod>,void>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb37040);
  std::
  unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
                 *)in_stack_fffffffffffffd40);
  __args_00 = (Builtins *)(local_1c8 + 0x38);
  std::make_unique<slang::ast::builtins::StringAtoRealMethod,slang::ast::builtins::Builtins&>
            (in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringAtoRealMethod,std::default_delete<slang::ast::builtins::StringAtoRealMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringAtoRealMethod,_std::default_delete<slang::ast::builtins::StringAtoRealMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb370a4);
  std::
  unique_ptr<slang::ast::builtins::StringAtoRealMethod,_std::default_delete<slang::ast::builtins::StringAtoRealMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringAtoRealMethod,_std::default_delete<slang::ast::builtins::StringAtoRealMethod>_>
                 *)in_stack_fffffffffffffd40);
  local_1c8._28_4_ = 0x117;
  local_1c8[0x1b] = 2;
  __args_1 = (KnownSystemName *)(local_1c8 + 0x20);
  std::
  make_unique<slang::ast::builtins::StringItoAMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,slang::LiteralBase>
            (__args_00,__args_1,(LiteralBase *)in_stack_fffffffffffffd58);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringItoAMethod,std::default_delete<slang::ast::builtins::StringItoAMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb3712b);
  std::
  unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
                 *)in_stack_fffffffffffffd40);
  local_1cc = 0x118;
  local_1cd = 3;
  __args = (Builtins *)local_1c8;
  std::
  make_unique<slang::ast::builtins::StringItoAMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,slang::LiteralBase>
            (__args_00,__args_1,(LiteralBase *)__args);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringItoAMethod,std::default_delete<slang::ast::builtins::StringItoAMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb371b2);
  std::
  unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
                 *)in_stack_fffffffffffffd40);
  local_1ec = 0x119;
  local_1ed = 1;
  std::
  make_unique<slang::ast::builtins::StringItoAMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,slang::LiteralBase>
            (__args_00,__args_1,(LiteralBase *)__args);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringItoAMethod,std::default_delete<slang::ast::builtins::StringItoAMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb37239);
  std::
  unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
                 *)in_stack_fffffffffffffd40);
  local_20c = 0x11a;
  local_20d = 0;
  std::
  make_unique<slang::ast::builtins::StringItoAMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,slang::LiteralBase>
            (__args_00,__args_1,(LiteralBase *)__args);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringItoAMethod,std::default_delete<slang::ast::builtins::StringItoAMethod>,void>
            (in_stack_fffffffffffffd40,
             (unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
              *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb372c0);
  std::
  unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
                 *)in_stack_fffffffffffffd40);
  this_00 = &local_228;
  std::make_unique<slang::ast::builtins::StringRealtoAMethod,slang::ast::builtins::Builtins&>
            (__args);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringRealtoAMethod,std::default_delete<slang::ast::builtins::StringRealtoAMethod>,void>
            (this_00,(unique_ptr<slang::ast::builtins::StringRealtoAMethod,_std::default_delete<slang::ast::builtins::StringRealtoAMethod>_>
                      *)in_stack_fffffffffffffd38);
  addSystemMethod(in_RDI,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xb37324);
  std::
  unique_ptr<slang::ast::builtins::StringRealtoAMethod,_std::default_delete<slang::ast::builtins::StringRealtoAMethod>_>
  ::~unique_ptr((unique_ptr<slang::ast::builtins::StringRealtoAMethod,_std::default_delete<slang::ast::builtins::StringRealtoAMethod>_>
                 *)this_00);
  return;
}

Assistant:

void Builtins::registerStringMethods() {
    using parsing::KnownSystemName;

#define REGISTER(kind, name, ...) addSystemMethod(kind, std::make_unique<name##Method>(__VA_ARGS__))
    REGISTER(SymbolKind::StringType, StringLen, *this);
    REGISTER(SymbolKind::StringType, StringPutc, *this);
    REGISTER(SymbolKind::StringType, StringGetc, *this);
    REGISTER(SymbolKind::StringType, StringUpperLower, *this, KnownSystemName::ToUpper, true);
    REGISTER(SymbolKind::StringType, StringUpperLower, *this, KnownSystemName::ToLower, false);
    REGISTER(SymbolKind::StringType, StringCompare, *this, KnownSystemName::Compare, false);
    REGISTER(SymbolKind::StringType, StringCompare, *this, KnownSystemName::ICompare, true);
    REGISTER(SymbolKind::StringType, StringSubstr, *this);
    REGISTER(SymbolKind::StringType, StringAtoI, *this, KnownSystemName::AToI, 10);
    REGISTER(SymbolKind::StringType, StringAtoI, *this, KnownSystemName::AToHex, 16);
    REGISTER(SymbolKind::StringType, StringAtoI, *this, KnownSystemName::AToOct, 8);
    REGISTER(SymbolKind::StringType, StringAtoI, *this, KnownSystemName::AToBin, 2);
    REGISTER(SymbolKind::StringType, StringAtoReal, *this);
    REGISTER(SymbolKind::StringType, StringItoA, *this, KnownSystemName::IToA,
             LiteralBase::Decimal);
    REGISTER(SymbolKind::StringType, StringItoA, *this, KnownSystemName::HexToA, LiteralBase::Hex);
    REGISTER(SymbolKind::StringType, StringItoA, *this, KnownSystemName::OctToA,
             LiteralBase::Octal);
    REGISTER(SymbolKind::StringType, StringItoA, *this, KnownSystemName::BinToA,
             LiteralBase::Binary);
    REGISTER(SymbolKind::StringType, StringRealtoA, *this);

#undef REGISTER
}